

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O1

void Qentem::Digit::powerOfNegativeTen<unsigned_long_long>
               (unsigned_long_long *number,SizeT32 exponent)

{
  SizeT32 SVar1;
  uint uVar2;
  ulong uVar3;
  BigInt<unsigned_long_long,_256U> *pBVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  unsigned_long_long *puVar10;
  SizeT32 SVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  uint uVar17;
  BigInt<unsigned_long_long,_256U> local_68;
  ulong local_40;
  ulong *local_38;
  
  pBVar4 = &local_68;
  local_68.storage_[2] = 0;
  local_68.storage_[3] = 0;
  local_68.index_ = 0;
  local_68.storage_[1] = *number;
  local_68.storage_[0] = 0;
  uVar3 = 2;
  do {
    local_68.index_ = (int)uVar3 - 1;
    uVar3 = (ulong)local_68.index_;
  } while (local_68.storage_[uVar3] == 0);
  local_38 = number;
  uVar9 = exponent + 0x40;
  if (0x1a < exponent) {
    do {
      local_40 = CONCAT44(local_40._4_4_,uVar9);
      SVar11 = local_68.index_ + 1;
      puVar10 = local_68.storage_ + local_68.index_;
      do {
        uVar12 = *puVar10 & 0xffffffff;
        uVar3 = uVar12 * 0x91e07e48;
        uVar7 = *puVar10 >> 0x20;
        uVar14 = (uVar3 >> 0x20) + uVar7 * 0x91e07e48;
        uVar12 = uVar12 * 0x9e74d1b7 + (uVar14 & 0xffffffff);
        *puVar10 = uVar12 << 0x20 | uVar3 & 0xffffffff;
        BigInt<unsigned_long_long,_256U>::Add
                  (&local_68,(uVar12 >> 0x20) + (uVar14 >> 0x20) + uVar7 * 0x9e74d1b7,SVar11);
        SVar1 = local_68.index_;
        puVar10 = puVar10 + -1;
        SVar11 = SVar11 - 1;
      } while (SVar11 != 0);
      uVar3 = (ulong)local_68.index_;
      if (uVar3 == 0) {
        local_68.storage_[0] = 0;
      }
      else {
        uVar9 = local_68.index_ + 1;
        if (uVar9 < 3) {
          uVar9 = 2;
        }
        memmove(&local_68,local_68.storage_ + 1,(ulong)(uVar9 - 1) << 3);
        local_68.storage_[uVar3] = 0;
        local_68.index_ = SVar1 - 1;
      }
      uVar9 = (int)local_40 + 0x3e;
      exponent = exponent - 0x1b;
    } while (0x1a < exponent);
  }
  if (exponent != 0) {
    local_40 = (ulong)exponent;
    SVar11 = local_68.index_ + 1;
    uVar3 = *(ulong *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFive(unsigned_int)::
                       PowerOfOneOverFive + (ulong)exponent * 8) & 0xffffffff;
    uVar7 = *(ulong *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFive(unsigned_int)::
                       PowerOfOneOverFive + (ulong)exponent * 8) >> 0x20;
    puVar10 = local_68.storage_ + local_68.index_;
    do {
      uVar13 = *puVar10 & 0xffffffff;
      uVar14 = uVar13 * uVar3;
      uVar12 = *puVar10 >> 0x20;
      uVar8 = (uVar14 >> 0x20) + uVar12 * uVar3;
      uVar13 = uVar13 * uVar7 + (uVar8 & 0xffffffff);
      *puVar10 = uVar13 << 0x20 | uVar14 & 0xffffffff;
      BigInt<unsigned_long_long,_256U>::Add
                (&local_68,(uVar13 >> 0x20) + (uVar8 >> 0x20) + uVar12 * uVar7,SVar11);
      SVar1 = local_68.index_;
      puVar10 = puVar10 + -1;
      SVar11 = SVar11 - 1;
    } while (SVar11 != 0);
    uVar3 = (ulong)local_68.index_;
    if (uVar3 == 0) {
      local_68.storage_[0] = 0;
    }
    else {
      uVar2 = 2;
      if (2 < local_68.index_ + 1) {
        uVar2 = local_68.index_ + 1;
      }
      memmove(&local_68,local_68.storage_ + 1,(ulong)(uVar2 - 1) << 3);
      local_68.storage_[uVar3] = 0;
      local_68.index_ = SVar1 - 1;
    }
    uVar9 = uVar9 + *(int *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFiveShift(unsigned_int)::
                             PowerOfOneOverFiveShift + local_40 * 4);
  }
  SVar11 = local_68.index_;
  uVar3 = (ulong)local_68.index_;
  uVar16 = (local_68.index_ << 6 | (uint)LZCOUNT(local_68.storage_[uVar3])) ^ 0x3f;
  uVar2 = uVar16 - 0x35;
  puVar15 = local_38;
  if (0x3f < uVar2) {
    uVar17 = uVar2 >> 6;
    uVar5 = uVar17;
    if (local_68.index_ < uVar17) {
      if (local_68.index_ != 0) {
        memset((void *)((long)&local_68 + (uVar3 - (local_68.index_ - 1)) * 8),0,uVar3 * 8);
        local_68.index_ = 0;
      }
      local_68.storage_[0] = 0;
    }
    else {
      do {
        pBVar4->storage_[0] = local_68.storage_[uVar5];
        uVar5 = uVar5 + 1;
        pBVar4 = (BigInt<unsigned_long_long,_256U> *)((long)pBVar4 + 8);
        uVar6 = uVar17;
      } while (uVar5 <= local_68.index_);
      do {
        local_68.storage_[local_68.index_] = 0;
        local_68.index_ = local_68.index_ - 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    puVar15 = local_38;
    if (SVar11 < uVar17) goto LAB_001246eb;
    uVar2 = uVar2 & 0x3f;
  }
  if (uVar2 != 0) {
    uVar3 = local_68.storage_[0] >> ((byte)uVar2 & 0x3f);
    local_68.storage_[0] = uVar3;
    if ((ulong)local_68.index_ != 0) {
      uVar7 = 0;
      do {
        uVar12 = local_68.storage_[uVar7 + 1];
        local_68.storage_[uVar7] = uVar12 << ((ulong)(0x40 - uVar2) & 0x3f) | uVar3;
        uVar3 = uVar12 >> ((ulong)uVar2 & 0x3f);
        local_68.storage_[uVar7 + 1] = uVar3;
        uVar7 = uVar7 + 1;
      } while (local_68.index_ != uVar7);
    }
  }
LAB_001246eb:
  *puVar15 = local_68.storage_[0];
  uVar2 = uVar9 - uVar16;
  if (uVar9 < uVar16 || uVar2 == 0) {
    uVar3 = ((uint)local_68.storage_[0] & 1) + local_68.storage_[0];
    *puVar15 = uVar3 >> 1;
    uVar3 = (ulong)(((uVar16 - uVar9) - (uint)(uVar3 >> 0x36 == 0)) + 0x400);
  }
  else if (uVar2 < 0x3ff) {
    uVar3 = ((uint)local_68.storage_[0] & 1) + local_68.storage_[0];
    *puVar15 = uVar3 >> 1;
    uVar3 = (ulong)(0x3ff - ((uVar2 - 1) + (uint)(uVar3 >> 0x36 == 0)));
  }
  else {
    uVar3 = (local_68.storage_[0] >> ((ulong)(uVar2 - 0x3fe) & 0x3f)) +
            (ulong)((local_68.storage_[0] >> ((ulong)(uVar2 - 0x3fe) & 0x3f) & 1) != 0);
    *puVar15 = uVar3 >> 1;
    uVar3 = (ulong)(uVar3 >> 0x35 != 0);
  }
  *puVar15 = uVar3 << 0x34 | *puVar15 & 0xfffffffffffff;
  return;
}

Assistant:

static void powerOfNegativeTen(Number_T &number, SizeT32 exponent) noexcept {
        using UNumber_T  = SizeT64;
        using DigitConst = DigitUtils::DigitConst<sizeof(UNumber_T)>;
        //////////////////////////////////////////////////////////////
        BigInt<UNumber_T, 256U> b_int{number};
        //////////////////////////////////////////////////////////////
        SizeT32 shifted{exponent};
        //////////////////////////////////////////////////////////////
        shifted += 64U;
        b_int <<= 64U;
        //////////////////////////////////////////////////////////////
        constexpr bool is_size_8 = (sizeof(UNumber_T) == 8U);
        if QENTEM_CONST_EXPRESSION (is_size_8) {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                // 2**126 = 85070591730234615865843651857942052864
                // 5**27 = 7450580596923828125 (MaxPowerOfFive)
                // 2**126 / 5**27 = 11417981541647679048.4
                // 126-64=62; See 2**126 and 64 shift

                b_int *= DigitConst::GetPowerOfOneOverFive(DigitConst::MaxPowerOfFive);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(DigitConst::MaxPowerOfFive);
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int *= DigitConst::GetPowerOfOneOverFive(exponent);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(exponent);
            }
        } else {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);
                shifted += DigitConst::MaxShift;
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(exponent);
                shifted += DigitConst::MaxShift;
            }
        }
        //////////////////////////////////////////////////////////////
        SizeT32       exp = DigitUtils::RealNumberInfo<double, 8U>::Bias; // double only
        const SizeT32 bit = b_int.FindLastBit();

        // if (bit <= 52U) {
        //     number = SizeT64(b_int);
        //     number <<= (53U - bit);
        // } else {
        b_int >>= (bit - SizeT32{53});
        number = SizeT64(b_int);
        // }
        //////////////////////////////////////////////////////////////
        if (shifted <= bit) {
            shifted = (bit - shifted);
            exp += shifted;

            number += (number & Number_T{1});
            number >>= 1U;
            exp += (number > Number_T{0x1FFFFFFFFFFFFF});
        } else {
            shifted -= bit;

            if (exp > shifted) {
                exp -= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp += (number > Number_T{0x1FFFFFFFFFFFFF});
            } else {
                shifted -= exp;
                ++shifted;
                number >>= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp = (number > Number_T{0xFFFFFFFFFFFFF});
            }
        }

        number &= 0xFFFFFFFFFFFFFULL;
        number |= (SizeT64(exp) << 52U);
    }